

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cpp
# Opt level: O3

void __thiscall field3d<cellbe>::field3d(field3d<cellbe> *this,int nx0,int ny0,int nz0)

{
  int iVar1;
  cellbe *pcVar2;
  undefined1 auVar3 [16];
  cellbe ***__s;
  cellbe **ppcVar4;
  cellbe *__s_00;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  pointer *__ptr;
  
  uVar9 = (ulong)(uint)nx0 * 8;
  this->nx = nx0;
  this->ny = ny0;
  this->nz = nz0;
  (this->p3)._M_t.super___uniq_ptr_impl<cellbe,_std::default_delete<cellbe[]>_>._M_t.
  super__Tuple_impl<0UL,_cellbe_*,_std::default_delete<cellbe[]>_>.
  super__Head_base<0UL,_cellbe_*,_false>._M_head_impl = (cellbe *)0x0;
  (this->p)._M_t.super___uniq_ptr_impl<cellbe_**,_std::default_delete<cellbe_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>.
  super__Head_base<0UL,_cellbe_***,_false>._M_head_impl = (cellbe ***)0x0;
  (this->p2)._M_t.super___uniq_ptr_impl<cellbe_*,_std::default_delete<cellbe_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellbe_**,_std::default_delete<cellbe_*[]>_>.
  super__Head_base<0UL,_cellbe_**,_false>._M_head_impl = (cellbe **)0x0;
  if (nx0 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  __s = (cellbe ***)operator_new__(uVar9);
  memset(__s,0,uVar9);
  uVar10 = ny0 * nx0;
  uVar9 = (ulong)uVar10 * 8;
  if ((int)uVar10 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  (this->p)._M_t.super___uniq_ptr_impl<cellbe_**,_std::default_delete<cellbe_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>.
  super__Head_base<0UL,_cellbe_***,_false>._M_head_impl = __s;
  ppcVar4 = (cellbe **)operator_new__(uVar9);
  memset(ppcVar4,0,uVar9);
  (this->p2)._M_t.super___uniq_ptr_impl<cellbe_*,_std::default_delete<cellbe_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellbe_**,_std::default_delete<cellbe_*[]>_>.
  super__Head_base<0UL,_cellbe_**,_false>._M_head_impl = ppcVar4;
  if (0 < nx0) {
    lVar5 = 0;
    uVar9 = 0;
    do {
      ppcVar4 = (cellbe **)
                ((long)(this->p2)._M_t.
                       super___uniq_ptr_impl<cellbe_*,_std::default_delete<cellbe_*[]>_>._M_t.
                       super__Tuple_impl<0UL,_cellbe_**,_std::default_delete<cellbe_*[]>_>.
                       super__Head_base<0UL,_cellbe_**,_false>._M_head_impl + lVar5);
      lVar5 = lVar5 + (long)ny0 * 8;
      (this->p)._M_t.super___uniq_ptr_impl<cellbe_**,_std::default_delete<cellbe_**[]>_>._M_t.
      super__Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>.
      super__Head_base<0UL,_cellbe_***,_false>._M_head_impl[uVar9] = ppcVar4;
      uVar9 = uVar9 + 1;
    } while ((uint)nx0 != uVar9);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(int)(uVar10 * nz0);
  uVar9 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
    uVar9 = SUB168(auVar3 * ZEXT816(0x18),0);
  }
  __s_00 = (cellbe *)operator_new__(uVar9);
  memset(__s_00,0,uVar9);
  pcVar2 = (this->p3)._M_t.super___uniq_ptr_impl<cellbe,_std::default_delete<cellbe[]>_>._M_t.
           super__Tuple_impl<0UL,_cellbe_*,_std::default_delete<cellbe[]>_>.
           super__Head_base<0UL,_cellbe_*,_false>._M_head_impl;
  (this->p3)._M_t.super___uniq_ptr_impl<cellbe,_std::default_delete<cellbe[]>_>._M_t.
  super__Tuple_impl<0UL,_cellbe_*,_std::default_delete<cellbe[]>_>.
  super__Head_base<0UL,_cellbe_*,_false>._M_head_impl = __s_00;
  if (pcVar2 != (cellbe *)0x0) {
    operator_delete__(pcVar2);
    nx0 = this->nx;
  }
  if (0 < nx0) {
    uVar10 = this->ny;
    iVar1 = this->nz;
    iVar6 = 0;
    uVar9 = 0;
    do {
      if (0 < (int)uVar10) {
        uVar8 = 0;
        iVar7 = iVar6;
        do {
          lVar5 = (long)iVar7;
          iVar7 = iVar7 + iVar1;
          (this->p)._M_t.super___uniq_ptr_impl<cellbe_**,_std::default_delete<cellbe_**[]>_>._M_t.
          super__Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>.
          super__Head_base<0UL,_cellbe_***,_false>._M_head_impl[uVar9][uVar8] =
               (this->p3)._M_t.super___uniq_ptr_impl<cellbe,_std::default_delete<cellbe[]>_>._M_t.
               super__Tuple_impl<0UL,_cellbe_*,_std::default_delete<cellbe[]>_>.
               super__Head_base<0UL,_cellbe_*,_false>._M_head_impl + lVar5;
          uVar8 = uVar8 + 1;
        } while (uVar10 != uVar8);
      }
      uVar9 = uVar9 + 1;
      iVar6 = iVar6 + uVar10 * iVar1;
    } while (uVar9 != (uint)nx0);
  }
  return;
}

Assistant:

field3d<T>::field3d(int nx0, int ny0, int nz0) : nx(nx0), ny(ny0), nz(nz0) {

    p = std::unique_ptr<T**[]>(new T**[nx]());

    p2 = std::unique_ptr<T*[]>(new T*[nx * ny]());
    for(int i=0; i<nx; i++)
    {
        p[i] = &(p2[ny*i]);
    }

    p3 = std::unique_ptr<T[]>(new T[nx * ny * nz]());
    for(int i=0; i<nx; i++)
    {
        for(int j=0; j<ny; j++)
        {
            p[i][j] = &(p3[nz*ny*i + nz*j]);
        }
    }
}